

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int handle_close(quicly_conn_t *conn,int err,uint64_t frame_type,ptls_iovec_t reason_phrase)

{
  st_quicly_closed_by_remote_t *psVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((conn->super).state < QUICLY_STATE_CLOSING) {
    iVar2 = enter_close(conn,0,(uint)((err & 0xfffffffeU) != 0xff04));
    if (iVar2 == 0) {
      psVar1 = ((conn->super).ctx)->closed_by_remote;
      if (psVar1 != (st_quicly_closed_by_remote_t *)0x0) {
        (*psVar1->cb)(psVar1,conn,err,frame_type,(char *)reason_phrase.base,reason_phrase.len);
      }
      iVar2 = 0;
      destroy_all_streams(conn,err,0);
    }
  }
  return iVar2;
}

Assistant:

int handle_close(quicly_conn_t *conn, int err, uint64_t frame_type, ptls_iovec_t reason_phrase)
{
    int ret;

    if (conn->super.state >= QUICLY_STATE_CLOSING)
        return 0;

    /* switch to closing state, notify the app (at this moment the streams are accessible), then destroy the streams */
    if ((ret = enter_close(conn, 0,
                           !(err == QUICLY_ERROR_RECEIVED_STATELESS_RESET || err == QUICLY_ERROR_NO_COMPATIBLE_VERSION))) != 0)
        return ret;
    if (conn->super.ctx->closed_by_remote != NULL)
        conn->super.ctx->closed_by_remote->cb(conn->super.ctx->closed_by_remote, conn, err, frame_type,
                                              (const char *)reason_phrase.base, reason_phrase.len);
    destroy_all_streams(conn, err, 0);

    return 0;
}